

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

bool __thiscall FStateDefinitions::SetStop(FStateDefinitions *this)

{
  if (this->laststate == (FState *)0x0) {
    if (this->lastlabel < 0) {
      return false;
    }
    RetargetStatePointers(this->lastlabel + 1,(char *)0x0,&this->StateLabels);
    if (this->laststatebeforelabel == (FState *)0x0) {
      return true;
    }
    this->laststatebeforelabel->DefineFlags = '\x02';
  }
  else {
    this->laststate->DefineFlags = '\x02';
  }
  this->laststatebeforelabel = (FState *)0x0;
  return true;
}

Assistant:

bool FStateDefinitions::SetStop()
{
	if (laststate != NULL)
	{
		laststate->DefineFlags = SDF_STOP;
		laststatebeforelabel = NULL;
		return true;
	}
	else if (lastlabel >=0)
	{
		RetargetStates (lastlabel+1, NULL);
		if (laststatebeforelabel != NULL)
		{
			laststatebeforelabel->DefineFlags = SDF_STOP;
			laststatebeforelabel = NULL;
		}
		return true;
	}
	return false;
}